

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

size_t scriptint_get_length(int64_t signed_v)

{
  size_t local_30;
  byte local_21;
  long lStack_20;
  uchar last;
  size_t len;
  uint64_t v;
  int64_t signed_v_local;
  
  local_30 = signed_v;
  if (signed_v < 0) {
    local_30 = -signed_v;
  }
  lStack_20 = 0;
  local_21 = 0;
  for (len = local_30; len != 0; len = len >> 8) {
    local_21 = (byte)len;
    lStack_20 = lStack_20 + 1;
  }
  return lStack_20 + (int)(uint)((local_21 & 0x80) != 0);
}

Assistant:

static size_t scriptint_get_length(int64_t signed_v)
{
    uint64_t v = signed_v < 0 ? -signed_v : signed_v;
    size_t len = 0;
    unsigned char last = 0;

    while (v) {
        last = v & 0xff;
        len += 1;
        v >>= 8;
    }
    return len + (last & 0x80 ? 1 : 0);
}